

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

void __thiscall tcmalloc::PageHeap::RegisterSizeClass(PageHeap *this,Span *span,uint32_t sc)

{
  Length LVar1;
  Length i;
  ulong uVar2;
  ulong uVar3;
  
  span->field_0x2a = (char)sc;
  LVar1 = span->length;
  for (uVar2 = 1; uVar2 < LVar1 - 1; uVar2 = uVar2 + 1) {
    uVar3 = span->start + uVar2;
    (this->pagemap_).root_[uVar3 >> 0x12]->values[(uint)uVar3 & 0x3ffff] = span;
  }
  return;
}

Assistant:

void PageHeap::RegisterSizeClass(Span* span, uint32_t sc) {
  // Associate span object with all interior pages as well
  ASSERT(span->location == Span::IN_USE);
  ASSERT(GetDescriptor(span->start) == span);
  ASSERT(GetDescriptor(span->start+span->length-1) == span);
  span->sizeclass = sc;
  for (Length i = 1; i < span->length-1; i++) {
    pagemap_.set(span->start+i, span);
  }
}